

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseUninterpretedBlock(Parser *this,string *value)

{
  bool bVar1;
  size_type __rlen;
  int iVar2;
  char *pcVar3;
  Tokenizer *this_00;
  string_view text;
  
  text._M_str = "{";
  text._M_len = 1;
  bVar1 = Consume(this,text);
  if (bVar1) {
    this_00 = this->input_;
    if ((this_00->current_).type != TYPE_END) {
      iVar2 = 1;
      do {
        pcVar3 = (this_00->current_).text._M_dataplus._M_p;
        if ((this_00->current_).text._M_string_length == 1) {
          if (*pcVar3 == '}') {
            iVar2 = iVar2 + -1;
            if (iVar2 == 0) {
              io::Tokenizer::Next(this_00);
              return true;
            }
          }
          else if (*pcVar3 == '{') {
            iVar2 = iVar2 + 1;
          }
        }
        if (value->_M_string_length != 0) {
          std::__cxx11::string::push_back((char)value);
          pcVar3 = (this->input_->current_).text._M_dataplus._M_p;
        }
        std::__cxx11::string::_M_append((char *)value,(ulong)pcVar3);
        io::Tokenizer::Next(this->input_);
        this_00 = this->input_;
      } while ((this_00->current_).type != TYPE_END);
    }
    RecordError(this,(ErrorMaker)ZEXT816(0x64311a));
  }
  return false;
}

Assistant:

bool Parser::ParseUninterpretedBlock(std::string* value) {
  // Note that enclosing braces are not added to *value.
  // We do NOT use ConsumeEndOfStatement for this brace because it's delimiting
  // an expression, not a block of statements.
  DO(Consume("{"));
  int brace_depth = 1;
  while (!AtEnd()) {
    if (LookingAt("{")) {
      brace_depth++;
    } else if (LookingAt("}")) {
      brace_depth--;
      if (brace_depth == 0) {
        input_->Next();
        return true;
      }
    }
    // TODO: Interpret line/column numbers to preserve formatting
    if (!value->empty()) value->push_back(' ');
    value->append(input_->current().text);
    input_->Next();
  }
  RecordError("Unexpected end of stream while parsing aggregate value.");
  return false;
}